

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

void __thiscall
entityx::EntityManager::
ViewIterator<entityx::EntityManager::UnpackingView<Position,_Direction,_Tag>::Iterator,_false>::next
          (ViewIterator<entityx::EntityManager::UnpackingView<Position,_Direction,_Tag>::Iterator,_false>
           *this)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  Entity entity;
  Entity local_10;
  
  uVar2 = this->i_;
  local_10.manager_ = this->manager_;
  uVar1 = (this->mask_).super__Base_bitset<1UL>._M_w;
  while( true ) {
    uVar3 = (ulong)uVar2;
    if (this->capacity_ <= uVar3) {
      return;
    }
    if ((uVar1 & ~*(ulong *)(*(long *)(local_10.manager_ + 0x48) + uVar3 * 8)) == 0) break;
    uVar2 = uVar2 + 1;
    this->i_ = uVar2;
  }
  local_10.id_.id_ =
       CONCAT44(*(undefined4 *)(*(long *)(local_10.manager_ + 0x60) + uVar3 * 4),uVar2);
  UnpackingView<Position,_Direction,_Tag>::Iterator::next_entity((Iterator *)this,&local_10);
  return;
}

Assistant:

void next() {
      while (i_ < capacity_ && !predicate()) {
        ++i_;
      }

      if (i_ < capacity_) {
        Entity entity = manager_->get(manager_->create_id(i_));
        static_cast<Delegate*>(this)->next_entity(entity);
      }
    }